

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O3

bool ExprEval::Operator::add_custom_operator(CustomOperator *custom_operator)

{
  __normal_iterator<const_ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  __last;
  pointer pCVar1;
  vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
  *pvVar2;
  __normal_iterator<const_ExprEval::Operator::CustomOperator_*,_std::vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>_>
  _Var3;
  _Bind<bool_(*(ExprEval::Operator::CustomOperator,_std::_Placeholder<1>))(const_ExprEval::Operator::CustomOperator_&,_const_ExprEval::Operator::CustomOperator_&)>
  local_c0;
  
  pvVar2 = get_custom_table();
  _Var3._M_current =
       (pvVar2->
       super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (pvVar2->
       super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_c0._M_f = equals;
  CustomOperator::CustomOperator((CustomOperator *)&local_c0._M_bound_args,custom_operator);
  _Var3 = std::
          find_if<__gnu_cxx::__normal_iterator<ExprEval::Operator::CustomOperator_const*,std::vector<ExprEval::Operator::CustomOperator,std::allocator<ExprEval::Operator::CustomOperator>>>,std::_Bind<bool(*(ExprEval::Operator::CustomOperator,std::_Placeholder<1>))(ExprEval::Operator::CustomOperator_const&,ExprEval::Operator::CustomOperator_const&)>>
                    (_Var3,__last,&local_c0);
  pCVar1 = (pvVar2->
           super__Vector_base<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_c0._M_bound_args.
  super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>.
  super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.
  super_BaseSpecification._vptr_BaseSpecification = (_func_int **)&PTR__CustomOperator_00115cd0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_bound_args.
         super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>.
         super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.result.
         _M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_c0._M_bound_args.
                 super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>.
                 super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.
                 result + 0x10U)) {
    operator_delete(local_c0._M_bound_args.
                    super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>
                    .super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.
                    result._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_bound_args.
         super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>.
         super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.expression.
         _M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_c0._M_bound_args.
                 super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>.
                 super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.
                 expression + 0x10U)) {
    operator_delete(local_c0._M_bound_args.
                    super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>
                    .super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.
                    expression._M_dataplus._M_p);
  }
  if (local_c0._M_bound_args.
      super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>.
      super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.arg_positions.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_c0._M_bound_args.
                    super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>
                    .super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.
                    arg_positions.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_c0._M_bound_args.
             super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>.
             super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.variables
           );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_bound_args.
         super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>.
         super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.symbol.
         _M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)((long)&local_c0._M_bound_args.
                 super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>.
                 super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.
                 symbol + 0x10U)) {
    operator_delete(local_c0._M_bound_args.
                    super__Tuple_impl<0UL,_ExprEval::Operator::CustomOperator,_std::_Placeholder<1>_>
                    .super__Head_base<0UL,_ExprEval::Operator::CustomOperator,_false>._M_head_impl.
                    symbol._M_dataplus._M_p);
  }
  if (_Var3._M_current == pCVar1) {
    std::
    vector<ExprEval::Operator::CustomOperator,_std::allocator<ExprEval::Operator::CustomOperator>_>
    ::push_back(custom_operator_table,custom_operator);
  }
  return _Var3._M_current == pCVar1;
}

Assistant:

bool add_custom_operator(const CustomOperator& custom_operator){
            auto custom_table = get_custom_table();
            if(std::find_if(custom_table->cbegin(), custom_table->cend(), std::bind(Operator::equals, custom_operator, std::placeholders::_1)) == custom_table->cend()){
                custom_operator_table->push_back(custom_operator);
                return true;
            }
            return false;
        }